

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall Units_addUnitsVariations_Test::TestBody(Units_addUnitsVariations_Test *this)

{
  StandardUnit SVar1;
  string *psVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  UnitsPtr u;
  long *local_58;
  long *local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  long local_40 [2];
  unsigned_long local_30;
  string *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Units::create();
  psVar2 = local_28;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"compound_unit","");
  libcellml::NamedEntity::setName(psVar2);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  SVar1 = (StandardUnit)local_28;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>();
  libcellml::Units::addUnit(SVar1,YOTTA,1.0,1.0,(string *)0xd);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pcVar4 = "";
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
  libcellml::Units::addUnit((StandardUnit)local_28,0xc,2.0,5.5,(string *)0xfffffffd);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_58 = (long *)0x2;
  local_30 = libcellml::Units::unitCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_50,"size_t(2)","u->unitCount()",(unsigned_long *)&local_58,&local_30
            );
  if (local_50._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x70,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if (local_58 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, addUnitsVariations)
{
    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("compound_unit");

    u->addUnit(libcellml::Units::StandardUnit::AMPERE, libcellml::Units::Prefix::MICRO);
    u->addUnit(libcellml::Units::StandardUnit::KELVIN, -3, 2.0, 5.5);

    EXPECT_EQ(size_t(2), u->unitCount());
}